

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

char * libtorrent::aux::anon_unknown_135::list_name(torrent_list_index_t idx)

{
  int iVar1;
  int local_14;
  char *pcStack_10;
  torrent_list_index_t idx_local;
  
  local_14 = idx.m_val;
  iVar1 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_14);
  switch(iVar1) {
  case 0:
    pcStack_10 = "torrent_state_updates";
    break;
  case 1:
    pcStack_10 = "torrent_want_tick";
    break;
  case 2:
    pcStack_10 = "torrent_want_peers_download";
    break;
  case 3:
    pcStack_10 = "torrent_want_peers_finished";
    break;
  case 4:
    pcStack_10 = "torrent_want_scrape";
    break;
  case 5:
    pcStack_10 = "torrent_downloading_auto_managed";
    break;
  case 6:
    pcStack_10 = "torrent_seeding_auto_managed";
    break;
  case 7:
    pcStack_10 = "torrent_checking_auto_managed";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

char const* list_name(torrent_list_index_t const idx)
	{
#define TORRENT_LIST_NAME(n) case static_cast<int>(aux::session_interface:: n): return #n
		switch (static_cast<int>(idx))
		{
			TORRENT_LIST_NAME(torrent_state_updates);
			TORRENT_LIST_NAME(torrent_want_tick);
			TORRENT_LIST_NAME(torrent_want_peers_download);
			TORRENT_LIST_NAME(torrent_want_peers_finished);
			TORRENT_LIST_NAME(torrent_want_scrape);
			TORRENT_LIST_NAME(torrent_downloading_auto_managed);
			TORRENT_LIST_NAME(torrent_seeding_auto_managed);
			TORRENT_LIST_NAME(torrent_checking_auto_managed);
			default: TORRENT_ASSERT_FAIL_VAL(idx);
		}
#undef TORRENT_LIST_NAME
		return "";
	}